

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O1

lws * lws_create_new_server_wsi(lws_vhost *vhost,int fixed_tsi,char *desc)

{
  byte *pbVar1;
  uint uVar2;
  lws_context *plVar3;
  lws_protocols *plVar4;
  int iVar5;
  lws_log_cx *plVar6;
  lws *wsi;
  lws_log_cx_t *cx;
  uint *puVar7;
  ulong uVar8;
  char *format;
  ulong uVar9;
  _func_int_lws_fop_fd_t_lws_filepos_t_ptr_uint8_t_ptr_lws_filepos_t **pp_Var10;
  uint uVar11;
  
  if (fixed_tsi < 0) {
    plVar3 = vhost->context;
    if (plVar3->count_threads == 0) {
      fixed_tsi = -1;
    }
    else {
      puVar7 = &plVar3->pt[0].fds_count;
      uVar8 = 0xffffffff;
      uVar9 = 0;
      uVar11 = 0xffffffff;
      do {
        plVar6 = lwsl_context_get_cx(plVar3);
        _lws_log_cx(plVar6,lws_log_prepend_context,plVar3,0x10,"lws_get_idlest_tsi","%d %d\n",
                    (ulong)*puVar7,(ulong)(plVar3->fd_limit_per_thread - 1));
        uVar2 = *puVar7;
        if (uVar2 != plVar3->fd_limit_per_thread - 1 && uVar2 < uVar11) {
          uVar8 = uVar9 & 0xffffffff;
          uVar11 = uVar2;
        }
        fixed_tsi = (int)uVar8;
        uVar9 = uVar9 + 1;
        puVar7 = puVar7 + 0x68;
      } while (uVar9 < plVar3->count_threads);
    }
  }
  if (fixed_tsi < 0) {
    cx = lwsl_vhost_get_cx(vhost);
    format = "no space for new conn";
  }
  else {
    wsi = __lws_wsi_create_with_role
                    (vhost->context,fixed_tsi,(lws_role_ops *)0x0,(vhost->lc).log_cx);
    if (wsi != (lws *)0x0) {
      plVar3 = vhost->context;
      iVar5 = strcmp(desc,"adopted");
      pp_Var10 = &(plVar3->fops_platform).read;
      if (iVar5 == 0) {
        pp_Var10 = (_func_int_lws_fop_fd_t_lws_filepos_t_ptr_uint8_t_ptr_lws_filepos_t **)
                   (plVar3->canonical_hostname + 0x50);
      }
      uVar11 = 0;
      __lws_lc_tag(plVar3,(lws_lifecycle_group_t *)(pp_Var10 + 0x8d),&wsi->lc,desc);
      pbVar1 = (byte *)((long)&wsi->wsistate + 3);
      *pbVar1 = *pbVar1 | 0x20;
      wsi->tsi = (char)fixed_tsi;
      plVar6 = lwsl_wsi_get_cx(wsi);
      _lws_log_cx(plVar6,lws_log_prepend_wsi,wsi,0x10,"lws_create_new_server_wsi",
                  "joining vh %s, tsi %d",vhost->name,(ulong)(uint)(int)wsi->tsi);
      lws_vhost_bind_wsi(vhost,wsi);
      *(ulong *)&wsi->field_0x46e = *(ulong *)&wsi->field_0x46e & 0xffffffffffff9fff | 0x2000;
      wsi->retry_policy = vhost->retry_policy;
      lwsi_set_state(wsi,0x200);
      wsi->field_0x46e = wsi->field_0x46e & 0xfe;
      if (vhost != (lws_vhost *)0x0) {
        uVar11 = (uint)((vhost->tls).use_ssl != 0);
      }
      (wsi->tls).use_ssl = uVar11;
      plVar4 = vhost->protocols;
      (wsi->a).protocol = plVar4;
      wsi->user_space = (void *)0x0;
      (*plVar4->callback)(wsi,LWS_CALLBACK_WSI_CREATE,(void *)0x0,(void *)0x0,0);
      return wsi;
    }
    cx = lwsl_vhost_get_cx(vhost);
    format = "OOM";
  }
  _lws_log_cx(cx,lws_log_prepend_vhost,vhost,1,"lws_create_new_server_wsi",format);
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_create_new_server_wsi(struct lws_vhost *vhost, int fixed_tsi, const char *desc)
{
	struct lws *new_wsi;
	int n = fixed_tsi;

	if (n < 0)
		n = lws_get_idlest_tsi(vhost->context);

	if (n < 0) {
		lwsl_vhost_err(vhost, "no space for new conn");
		return NULL;
	}

	lws_context_lock(vhost->context, __func__);
	new_wsi = __lws_wsi_create_with_role(vhost->context, n, NULL,
					     vhost->lc.log_cx);
	lws_context_unlock(vhost->context);
	if (new_wsi == NULL) {
		lwsl_vhost_err(vhost, "OOM");
		return NULL;
	}

	lws_wsi_fault_timedclose(new_wsi);

	__lws_lc_tag(vhost->context, &vhost->context->lcg[
#if defined(LWS_ROLE_H2) || defined(LWS_ROLE_MQTT)
	strcmp(desc, "adopted") ? LWSLCG_WSI_MUX :
#endif
	LWSLCG_WSI_SERVER], &new_wsi->lc, desc);

	new_wsi->wsistate |= LWSIFR_SERVER;
	new_wsi->tsi = (char)n;
	lwsl_wsi_debug(new_wsi, "joining vh %s, tsi %d",
			vhost->name, new_wsi->tsi);

	lws_vhost_bind_wsi(vhost, new_wsi);
	new_wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;
	new_wsi->retry_policy = vhost->retry_policy;

	/* initialize the instance struct */

	lwsi_set_state(new_wsi, LRS_UNCONNECTED);
	new_wsi->hdr_parsing_completed = 0;

#ifdef LWS_WITH_TLS
	new_wsi->tls.use_ssl = LWS_SSL_ENABLED(vhost);
#endif

	/*
	 * these can only be set once the protocol is known
	 * we set an un-established connection's protocol pointer
	 * to the start of the supported list, so it can look
	 * for matching ones during the handshake
	 */
	new_wsi->a.protocol = vhost->protocols;
	new_wsi->user_space = NULL;

	/*
	 * outermost create notification for wsi
	 * no user_space because no protocol selection
	 */
	vhost->protocols[0].callback(new_wsi, LWS_CALLBACK_WSI_CREATE, NULL,
				     NULL, 0);

	return new_wsi;
}